

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cc
# Opt level: O1

bool __thiscall
re2::TestInstance::RunCase(TestInstance *this,StringPiece *text,StringPiece *context,Anchor anchor)

{
  int iVar1;
  int iVar2;
  undefined1 *puVar3;
  string *psVar4;
  ulong uVar5;
  uint32 uVar6;
  long lVar7;
  ostream *poVar8;
  ulong uVar9;
  StringPiece *s;
  StringPiece *pSVar10;
  ParseFlags flags;
  StringPiece *src;
  char *pcVar11;
  ulong uVar12;
  _Alloc_hider _Var13;
  Engine type;
  StringPiece *text_00;
  byte bVar14;
  uint uVar15;
  StringPiece *text_01;
  bool bVar16;
  Result r;
  Result correct;
  long local_460;
  string local_458;
  StringPiece *local_438;
  Anchor local_430;
  uint local_42c;
  string local_428;
  StringPiece *local_408;
  string local_400;
  Result local_3e0;
  LogMessage local_2c8;
  Result local_148;
  
  lVar7 = 0x10;
  do {
    *(undefined8 *)((long)(local_148.submatch + -1) + lVar7) = 0;
    *(undefined4 *)((long)local_148.submatch + lVar7 + -8) = 0;
    lVar7 = lVar7 + 0x10;
  } while (lVar7 != 0x120);
  RunSearch(this,kEngineBacktrack,text,context,anchor,&local_148);
  if (local_148.skipped == false) {
    type = kEngineNFA;
    uVar15 = 1;
    local_438 = text;
    local_430 = anchor;
    local_408 = context;
    do {
      uVar6 = Engines();
      if ((uVar6 >> (type & 0x1f) & 1) != 0) {
        lVar7 = 0x10;
        do {
          *(undefined8 *)((long)(local_3e0.submatch + -1) + lVar7) = 0;
          *(undefined4 *)((long)local_3e0.submatch + lVar7 + -8) = 0;
          lVar7 = lVar7 + 0x10;
        } while (lVar7 != 0x120);
        RunSearch(this,type,text,context,anchor,&local_3e0);
        if (local_3e0.skipped == false) {
          if (local_3e0.matched != local_148.matched) {
LAB_0011e8dc:
            if (type == kEnginePCRE) {
              uVar9 = (ulong)text->length_;
              bVar16 = 0 < (long)uVar9;
              if (0 < (long)uVar9) {
                if (*text->ptr_ < '\0') goto LAB_0011ebb2;
                uVar5 = 1;
                do {
                  uVar12 = uVar5;
                  if (uVar9 == uVar12) break;
                  uVar5 = uVar12 + 1;
                } while (-1 < text->ptr_[uVar12]);
                bVar16 = uVar12 < uVar9;
              }
              if (bVar16) goto LAB_0011ebb2;
            }
            uVar15 = uVar15 & 0xff;
            if (local_3e0.untrusted == false) {
              uVar15 = 0;
            }
            pcVar11 = "Mismatch: ";
            if (local_3e0.untrusted != false) {
              pcVar11 = "(Untrusted) Mismatch: ";
            }
            LogMatch(this,pcVar11,type,text,context,anchor);
            if (local_3e0.matched != local_148.matched) {
              if (local_3e0.matched == false) {
                LogMessage::LogMessage
                          (&local_2c8,
                           "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/tester.cc"
                           ,0x21a,0);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_2c8.str_,"   Should match (but does not).",0x1f);
                LogMessage::~LogMessage(&local_2c8);
                goto LAB_0011ebb2;
              }
              LogMessage::LogMessage
                        (&local_2c8,
                         "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/tester.cc"
                         ,0x218,0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_2c8.str_,"   Should not match (but does).",0x1f);
              LogMessage::~LogMessage(&local_2c8);
            }
            if (-1 < this->num_captures_) {
              local_460 = -1;
              text_01 = local_3e0.submatch;
              text_00 = local_148.submatch;
              local_42c = uVar15;
              do {
                if ((text_01->ptr_ == text_00->ptr_) &&
                   (text_01->ptr_ + text_01->length_ == text_00->ptr_ + text_00->length_)) {
                  pSVar10 = (StringPiece *)0x0;
                  LogMessage::LogMessage
                            (&local_2c8,
                             "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/tester.cc"
                             ,0x227,0);
                  FormatCapture_abi_cxx11_(&local_428,(re2 *)local_438,text_01,pSVar10);
                  StringPrintf_abi_cxx11_
                            (&local_458,"   $%d: %s ok",(ulong)((int)local_460 + 1),
                             local_428._M_dataplus._M_p);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_2c8.str_,local_458._M_dataplus._M_p,
                             local_458._M_string_length);
                  psVar4 = &local_458;
                  _Var13._M_p = local_458._M_dataplus._M_p;
                }
                else {
                  s = (StringPiece *)0x0;
                  LogMessage::LogMessage
                            (&local_2c8,
                             "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/tester.cc"
                             ,0x221,0);
                  pSVar10 = local_438;
                  FormatCapture_abi_cxx11_(&local_428,(re2 *)local_438,text_00,s);
                  _Var13._M_p = local_428._M_dataplus._M_p;
                  FormatCapture_abi_cxx11_(&local_400,(re2 *)pSVar10,text_01,s);
                  StringPrintf_abi_cxx11_
                            (&local_458,"   $%d: should be %s is %s",(ulong)((int)local_460 + 1),
                             _Var13._M_p,local_400._M_dataplus._M_p);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_2c8.str_,local_458._M_dataplus._M_p,
                             local_458._M_string_length);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_458._M_dataplus._M_p != &local_458.field_2) {
                    operator_delete(local_458._M_dataplus._M_p);
                  }
                  psVar4 = &local_400;
                  _Var13._M_p = local_400._M_dataplus._M_p;
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)_Var13._M_p != &psVar4->field_2) {
                  operator_delete(_Var13._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_428._M_dataplus._M_p != &local_428.field_2) {
                  operator_delete(local_428._M_dataplus._M_p);
                }
                LogMessage::~LogMessage(&local_2c8);
                local_460 = local_460 + 1;
                text_00 = text_00 + 1;
                text_01 = text_01 + 1;
                text = local_438;
                context = local_408;
                anchor = local_430;
                uVar15 = local_42c;
              } while (local_460 < this->num_captures_);
            }
            goto LAB_0011ebb2;
          }
          if ((local_3e0.have_submatch != false) || (local_3e0.have_submatch0 == true)) {
            lVar7 = 0x10;
            do {
              if (*(long *)((long)(local_148.submatch + -1) + lVar7) !=
                  *(long *)((long)(local_3e0.submatch + -1) + lVar7)) goto LAB_0011e8dc;
              iVar1 = *(int *)((long)local_148.submatch + lVar7 + -8);
              iVar2 = *(int *)((long)local_3e0.submatch + lVar7 + -8);
              if ((iVar1 != iVar2) || (local_3e0.have_submatch == false)) {
                if (iVar1 != iVar2) goto LAB_0011e8dc;
                break;
              }
              lVar7 = lVar7 + 0x10;
            } while (lVar7 != 0x120);
          }
        }
        if (FLAGS_log_okay == '\x01') {
          pcVar11 = "Okay: ";
          if (local_3e0.skipped != false) {
            pcVar11 = "Skipped: ";
          }
          LogMatch(this,pcVar11,type,text,context,anchor);
        }
      }
LAB_0011ebb2:
      bVar14 = (byte)uVar15;
      type = type + kEngineNFA;
    } while (type != kEngineMax);
    if (FLAGS_max_regexp_failures < 1 || (uVar15 & 1) != 0) goto LAB_0011ec28;
    FLAGS_max_regexp_failures = FLAGS_max_regexp_failures + -1;
    if (FLAGS_max_regexp_failures == 0) {
      LogMessage::LogMessage
                (&local_2c8,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/tester.cc"
                 ,0x230,3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_2c8.str_,"Too many regexp failures.",0x19);
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_2c8);
    }
  }
  else {
    if (this->regexp_ == (Regexp *)0x0) {
      bVar14 = 1;
      goto LAB_0011ec28;
    }
    LogMessage::LogMessage
              (&local_2c8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/tester.cc"
               ,0x1f0,2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_2c8.str_,"Skipped backtracking! ",0x16);
    CEscape_abi_cxx11_((string *)&local_3e0,(re2 *)this->regexp_str_,src);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_2c8.str_,
                        (char *)CONCAT44(local_3e0._4_4_,
                                         CONCAT13(local_3e0.have_submatch,
                                                  CONCAT12(local_3e0.untrusted,
                                                           CONCAT11(local_3e0.matched,
                                                                    local_3e0.skipped)))),
                        (long)local_3e0.submatch[0].ptr_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
    FormatMode_abi_cxx11_(&local_458,(re2 *)(ulong)this->flags_,flags);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,local_458._M_dataplus._M_p,local_458._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_458._M_dataplus._M_p != &local_458.field_2) {
      operator_delete(local_458._M_dataplus._M_p);
    }
    puVar3 = (undefined1 *)
             CONCAT44(local_3e0._4_4_,
                      CONCAT13(local_3e0.have_submatch,
                               CONCAT12(local_3e0.untrusted,
                                        CONCAT11(local_3e0.matched,local_3e0.skipped))));
    if ((int *)puVar3 != &local_3e0.submatch[0].length_) {
      operator_delete(puVar3);
    }
    LogMessage::~LogMessage(&local_2c8);
  }
  bVar14 = 0;
LAB_0011ec28:
  return (bool)(bVar14 & 1);
}

Assistant:

bool TestInstance::RunCase(const StringPiece& text, const StringPiece& context,
                           Prog::Anchor anchor) {
  // Backtracking is the gold standard.
  Result correct;
  RunSearch(kEngineBacktrack, text, context, anchor, &correct);
  if (correct.skipped) {
    if (regexp_ == NULL)
      return true;
    LOG(ERROR) << "Skipped backtracking! " << CEscape(regexp_str_)
               << " " << FormatMode(flags_);
    return false;
  }
  VLOG(1) << "Try: regexp " << CEscape(regexp_str_)
          << " text " << CEscape(text)
          << " (" << FormatKind(kind_)
          << ", " << FormatAnchor(anchor)
          << ", " << FormatMode(flags_)
          << ")";

  // Compare the others.
  bool all_okay = true;
  for (Engine i = kEngineBacktrack+1; i < kEngineMax; i++) {
    if (!(Engines() & (1<<i)))
      continue;

    Result r;
    RunSearch(i, text, context, anchor, &r);
    if (ResultOkay(r, correct)) {
      if (FLAGS_log_okay)
        LogMatch(r.skipped ? "Skipped: " : "Okay: ", i, text, context, anchor);
      continue;
    }

    // We disagree with PCRE on the meaning of some Unicode matches.
    // In particular, we treat non-ASCII UTF-8 as non-word characters.
    // We also treat "empty" character sets like [^\w\W] as being
    // impossible to match, while PCRE apparently excludes some code
    // points (e.g., 0x0080) from both \w and \W.
    if (i == kEnginePCRE && NonASCII(text))
      continue;

    if (!r.untrusted)
      all_okay = false;

    LogMatch(r.untrusted ? "(Untrusted) Mismatch: " : "Mismatch: ", i, text,
             context, anchor);
    if (r.matched != correct.matched) {
      if (r.matched) {
        LOG(INFO) << "   Should not match (but does).";
      } else {
        LOG(INFO) << "   Should match (but does not).";
        continue;
      }
    }
    for (int i = 0; i < 1+num_captures_; i++) {
      if (r.submatch[i].begin() != correct.submatch[i].begin() ||
          r.submatch[i].end() != correct.submatch[i].end()) {
        LOG(INFO) <<
          StringPrintf("   $%d: should be %s is %s",
                       i,
                       FormatCapture(text, correct.submatch[i]).c_str(),
                       FormatCapture(text, r.submatch[i]).c_str());
      } else {
        LOG(INFO) <<
          StringPrintf("   $%d: %s ok", i,
                       FormatCapture(text, r.submatch[i]).c_str());
      }
    }
  }

  if (!all_okay) {
    if (FLAGS_max_regexp_failures > 0 && --FLAGS_max_regexp_failures == 0)
      LOG(QFATAL) << "Too many regexp failures.";
  }

  return all_okay;
}